

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void deserialize_model<_IO_FILE*>(ExtIsoForest *model,_IO_FILE **in)

{
  bool bVar1;
  reference pvVar2;
  long in_RDI;
  IsoHPlane *node;
  iterator __end2;
  iterator __begin2;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *__range2;
  IsoHPlane *in_stack_00000020;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *tree;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  *__range1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  size_t veclen;
  size_t data_sizets [2];
  double data_doubles [2];
  uint8_t data_en [5];
  reference in_stack_ffffffffffffff58;
  iterator in_stack_ffffffffffffff60;
  iterator in_stack_ffffffffffffff68;
  reference in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff78;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *in_stack_ffffffffffffff80;
  __normal_iterator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_*,_std::vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>_>
  local_68;
  long local_60;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_20;
  byte local_15;
  byte local_14;
  byte local_13;
  char local_12;
  byte local_11;
  long local_8;
  
  if (!interrupt_switch) {
    local_8 = in_RDI;
    read_bytes<unsigned_char>
              (in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68._M_current,
               (FILE **)in_stack_ffffffffffffff60._M_current);
    *(uint *)(local_8 + 0x18) = (uint)local_15;
    *(uint *)(local_8 + 0x1c) = (uint)local_14;
    *(uint *)(local_8 + 0x20) = (uint)local_13;
    *(bool *)(local_8 + 0x40) = local_12 != '\0';
    *(uint *)(local_8 + 0x24) = (uint)local_11;
    read_bytes<double>(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68._M_current,
                       (FILE **)in_stack_ffffffffffffff60._M_current);
    *(undefined8 *)(local_8 + 0x28) = local_28;
    *(undefined8 *)(local_8 + 0x30) = local_20;
    read_bytes<unsigned_long>
              (in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68._M_current,
               (FILE **)in_stack_ffffffffffffff60._M_current);
    *(undefined8 *)(local_8 + 0x38) = local_38;
    std::
    vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
    ::resize((vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
              *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::
    vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
    ::shrink_to_fit((vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                     *)0x66b044);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x66b04e);
    local_60 = local_8;
    local_68._M_current =
         (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
         std::
         vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
         ::begin((vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  *)in_stack_ffffffffffffff58);
    std::
    vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
    ::end((vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
           *)in_stack_ffffffffffffff58);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_*,_std::vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>_>
                               *)in_stack_ffffffffffffff60._M_current,
                              (__normal_iterator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_*,_std::vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>_>
                               *)in_stack_ffffffffffffff58), bVar1) {
      pvVar2 = __gnu_cxx::
               __normal_iterator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_*,_std::vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>_>
               ::operator*(&local_68);
      read_bytes<unsigned_long>
                (in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68._M_current,
                 (FILE **)in_stack_ffffffffffffff60._M_current);
      std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::resize
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::shrink_to_fit
                ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)0x66b0d4);
      in_stack_ffffffffffffff68 =
           std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::begin
                     ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_stack_ffffffffffffff58);
      in_stack_ffffffffffffff60 =
           std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::end
                     ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_stack_ffffffffffffff58);
      in_stack_ffffffffffffff70 = pvVar2;
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<IsoHPlane_*,_std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>
                                 *)in_stack_ffffffffffffff60._M_current,
                                (__normal_iterator<IsoHPlane_*,_std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>
                                 *)in_stack_ffffffffffffff58), bVar1) {
        in_stack_ffffffffffffff58 =
             __gnu_cxx::
             __normal_iterator<IsoHPlane_*,_std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>::
             operator*((__normal_iterator<IsoHPlane_*,_std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>
                        *)&stack0xffffffffffffff68);
        deserialize_node<_IO_FILE*>
                  (in_stack_00000020,(_IO_FILE **)__range2,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__begin2._M_current);
        __gnu_cxx::
        __normal_iterator<IsoHPlane_*,_std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>::
        operator++((__normal_iterator<IsoHPlane_*,_std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>
                    *)&stack0xffffffffffffff68);
      }
      __gnu_cxx::
      __normal_iterator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_*,_std::vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>_>
      ::operator++(&local_68);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff70);
  }
  return;
}

Assistant:

void deserialize_model(ExtIsoForest &model, itype &in)
{
    if (interrupt_switch) return;

    uint8_t data_en[5];
    read_bytes<uint8_t>((void*)data_en, (size_t)5, in);
    model.new_cat_action = (NewCategAction)data_en[0];
    model.cat_split_type = (CategSplit)data_en[1];
    model.missing_action = (MissingAction)data_en[2];
    model.has_range_penalty = (bool)data_en[3];
    model.scoring_metric = (ScoringMetric)data_en[4];

    double data_doubles[2];
    read_bytes<double>((void*)data_doubles, (size_t)2, in);
    model.exp_avg_depth = data_doubles[0];
    model.exp_avg_sep = data_doubles[1];

    size_t data_sizets[2];
    read_bytes<size_t>((void*)data_sizets, (size_t)2, in);
    model.orig_sample_size = data_sizets[0];
    model.hplanes.resize(data_sizets[1]);
    model.hplanes.shrink_to_fit();

    size_t veclen;
    std::vector<uint8_t> buffer;
    for (auto &tree : model.hplanes) {
        read_bytes<size_t>((void*)&veclen, (size_t)1, in);
        tree.resize(veclen);
        tree.shrink_to_fit();
        for (auto &node : tree)
            deserialize_node(node, in, buffer);
    }
}